

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tool.h
# Opt level: O0

char Json::getDecimalPoint(void)

{
  lconv *plVar1;
  char local_11;
  lconv *lc;
  
  plVar1 = localeconv();
  if (plVar1 == (lconv *)0x0) {
    local_11 = '\0';
  }
  else {
    local_11 = *plVar1->decimal_point;
  }
  return local_11;
}

Assistant:

static char getDecimalPoint() {
#ifdef JSONCPP_NO_LOCALE_SUPPORT
  return '\0';
#else
  struct lconv* lc = localeconv();
  return lc ? *(lc->decimal_point) : '\0';
#endif
}